

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formula.cpp
# Opt level: O0

Am_Value * __thiscall
Formula_Context::Get
          (Formula_Context *this,Am_Object_Advanced *object,Am_Slot_Key key,Am_Slot_Flags flags)

{
  bool bVar1;
  bool bVar2;
  Am_Slot_Key AVar3;
  int iVar4;
  undefined4 extraout_var;
  Am_Slot_Data *pAVar5;
  Am_Value *pAVar6;
  Dependency *this_00;
  Am_Constraint_Tag pvVar7;
  size_t sVar8;
  bool bVar9;
  Dependency *new_dep;
  Am_Object local_40;
  Am_Slot local_38;
  Am_Slot slot;
  Am_Slot_Flags flags_local;
  Am_Slot_Key key_local;
  Am_Object_Advanced *object_local;
  Formula_Context *this_local;
  
  slot.data = (Am_Slot_Data *)flags;
  if ((flags & 4) == 0) {
    Am_Slot::Am_Slot(&local_38);
    if (this->current_position != (Dependency *)0x0) {
      local_38.data = (this->current_position->depended).data;
      pAVar5 = Am_Slot::operator_cast_to_Am_Slot_Data_(&local_38);
      bVar1 = false;
      bVar9 = false;
      if (pAVar5 != (Am_Slot_Data *)0x0) {
        Am_Slot::Get_Owner((Am_Slot *)&local_40);
        bVar1 = true;
        bVar2 = Am_Object::operator==(&local_40,&object->super_Am_Object);
        bVar9 = false;
        if (bVar2) {
          AVar3 = Am_Slot::Get_Key(&local_38);
          bVar9 = AVar3 == key;
        }
      }
      if (bVar1) {
        Am_Object_Advanced::~Am_Object_Advanced((Am_Object_Advanced *)&local_40);
      }
      if (bVar9) {
        this->last_position = this->current_position;
        this->current_position = this->current_position->next;
        Am_Slot::Validate(&local_38);
        pAVar6 = Am_Slot::Get(&local_38);
        return pAVar6;
      }
    }
    sVar8 = (size_t)key;
    local_38 = Am_Object_Advanced::Get_Slot(object,key);
    if (this->current_position == (Dependency *)0x0) {
      this_00 = (Dependency *)Dependency::operator_new((Dependency *)0x18,sVar8);
      (this_00->depended).data = (Am_Slot_Data *)0x0;
      this_00->dependency_tag = (Am_Constraint_Tag)0x0;
      this_00->next = (Dependency *)0x0;
      Dependency::Dependency(this_00);
      (this_00->depended).data = local_38.data;
      pvVar7 = Am_Slot::Add_Dependency(&local_38,(Am_Constraint *)this->context);
      this_00->dependency_tag = pvVar7;
      this_00->next = (Dependency *)0x0;
      if (this->last_position == (Dependency *)0x0) {
        this->context->depends_on = this_00;
      }
      else {
        this->last_position->next = this_00;
      }
      this->last_position = this_00;
    }
    else {
      this->context->internal_remove = true;
      Dependency::Move_Back_Dep(this->current_position,&local_38,(Am_Constraint *)this->context);
      this->context->internal_remove = false;
      this->last_position = this->current_position;
      this->current_position = this->current_position->next;
    }
    Am_Slot::Validate(&local_38);
    this_local = (Formula_Context *)Am_Slot::Get(&local_38);
  }
  else {
    iVar4 = (*Am_Empty_Constraint_Context->_vptr_Am_Constraint_Context[1])
                      (Am_Empty_Constraint_Context,object,(ulong)key,flags);
    this_local = (Formula_Context *)CONCAT44(extraout_var,iVar4);
  }
  return (Am_Value *)this_local;
}

Assistant:

const Am_Value &
Formula_Context::Get(const Am_Object_Advanced &object, Am_Slot_Key key,
                     Am_Slot_Flags flags)
{
  if (flags & Am_NO_DEPENDENCY)
    return Am_Empty_Constraint_Context->Get(object, key, flags);

  Am_Slot slot;

  if (current_position) {
    slot = current_position->depended;
    if (slot && (slot.Get_Owner() == object) && (slot.Get_Key() == key)) {
      last_position = current_position;
      current_position = current_position->next;
      slot.Validate();
      return slot.Get();
    }
  }
  slot = object.Get_Slot(key);
  if (current_position) {
    context->internal_remove = true;
    current_position->Move_Back_Dep(slot, context);
    context->internal_remove = false;
    last_position = current_position;
    current_position = current_position->next;
  } else {
    Dependency *new_dep = new Dependency();

    new_dep->depended = slot;
    new_dep->dependency_tag = slot.Add_Dependency(context);
    new_dep->next = nullptr;
    if (last_position)
      last_position->next = new_dep;
    else
      context->depends_on = new_dep;
    last_position = new_dep;
  }

  slot.Validate();
  return slot.Get();
}